

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<float>::TPZVec(TPZVec<float> *this,int64_t size,float *copy)

{
  float fVar1;
  float *pfVar2;
  int64_t i;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_016490a8;
  this->fStore = (float *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<float>::TPZVec(const int64_t, const T &) [T = float]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size == 0) {
      pfVar2 = (float *)0x0;
    }
    else {
      pfVar2 = (float *)operator_new__(-(ulong)((ulong)size >> 0x3e != 0) | size * 4);
      this->fStore = pfVar2;
    }
    this->fNElements = size;
    this->fNAlloc = size;
    fVar1 = *copy;
    for (lVar3 = 0; size != lVar3; lVar3 = lVar3 + 1) {
      pfVar2[lVar3] = fVar1;
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}